

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O1

void __thiscall VectorDouble::storeValue(VectorDouble *this,double v,unsigned_long l)

{
  ulong uVar1;
  double *pdVar2;
  long lVar3;
  
  uVar1 = this->vaLength;
  if (uVar1 <= l) {
    lVar3 = (l + 1) - uVar1;
    if (lVar3 < vDefaultBoost) {
      lVar3 = vDefaultBoost;
    }
    this->vaLength = lVar3 + uVar1;
    pdVar2 = (double *)realloc(this->vData,(lVar3 + uVar1) * 8);
    this->vData = pdVar2;
    this->vLength = l + 1;
  }
  this->vData[l] = v;
  return;
}

Assistant:

void VectorDouble::storeValue(const double v, const unsigned long l) {
  long addThis;
  if (l >= vaLength) {
    addThis = l - vaLength + 1;
    if (VectorDouble::vDefaultBoost > addThis)
      addThis = VectorDouble::vDefaultBoost;
    vaLength += addThis;
    vData = (double *)realloc(vData, sizeof(double) * vaLength);
    vLength = l + 1;
  }
  vData[l] = v;
}